

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

bool __thiscall soul::heart::IODeclaration::canHandleType(IODeclaration *this,Type *t)

{
  bool bVar1;
  Type local_70;
  Type local_58;
  reference local_40;
  Type *type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range2;
  Type *t_local;
  IODeclaration *this_local;
  
  __end2 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin(&this->dataTypes);
  type = (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end(&this->dataTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                                *)&type);
    if (!bVar1) {
      return false;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
               ::operator*(&__end2);
    Type::Type(&local_70,local_40);
    getSampleArrayType(&local_58,this,&local_70);
    bVar1 = TypeRules::canSilentlyCastTo(&local_58,t);
    Type::~Type(&local_58);
    Type::~Type(&local_70);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
    operator++(&__end2);
  }
  return true;
}

Assistant:

bool canHandleType (const Type& t) const
        {
            for (auto& type : dataTypes)
                if (TypeRules::canSilentlyCastTo (getSampleArrayType (type), t))
                    return true;

            return false;
        }